

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

_Bool is_valid_tx(wally_tx *tx)

{
  if ((((tx != (wally_tx *)0x0) &&
       ((tx->inputs != (wally_tx_input *)0x0) != (tx->inputs_allocation_len == 0))) &&
      ((tx->outputs != (wally_tx_output *)0x0) != (tx->outputs_allocation_len == 0))) &&
     ((tx->inputs != (wally_tx_input *)0x0 || (tx->num_inputs == 0)))) {
    return tx->num_outputs == 0 || tx->outputs != (wally_tx_output *)0x0;
  }
  return false;
}

Assistant:

static bool is_valid_tx(const struct wally_tx *tx)
{
    /* Note: The last two conditions are redundant, but having them here
     *       ensures accurate static analysis from tools like clang.
     */
    return tx &&
           BYTES_VALID(tx->inputs, tx->inputs_allocation_len) &&
           BYTES_VALID(tx->outputs, tx->outputs_allocation_len) &&
           (tx->num_inputs == 0 || tx->inputs != NULL) &&
           (tx->num_outputs == 0 || tx->outputs != NULL);
}